

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O3

void __thiscall
QMenuPrivate::scrollMenu(QMenuPrivate *this,QAction *action,ScrollLocation location,bool active)

{
  int *piVar1;
  int iVar2;
  QWidget *this_00;
  QWidget *pQVar3;
  QRect *pQVar4;
  QWidgetData *pQVar5;
  Data *this_01;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  QRect QVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  Representation RVar14;
  QStyle *pQVar15;
  pointer pQVar16;
  Node<QAction_*,_QWidget_*> *pNVar17;
  int iVar18;
  uint uVar19;
  QMenuScroller *pQVar20;
  int iVar21;
  uint uVar22;
  long lVar23;
  Representation RVar24;
  long lVar25;
  uint uVar26;
  Representation RVar27;
  byte bVar28;
  uint uVar29;
  ulong uVar30;
  long in_FS_OFFSET;
  QRect QVar31;
  QRect local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->scroll != (QMenuScroller *)0x0) && (this->scroll->scrollFlags != '\0')) {
    this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
    iVar11 = 0;
    local_48 = popupGeometry(this,(QScreen *)0x0);
    updateActionRects(this,&local_48);
    bVar28 = this->scroll->scrollFlags;
    iVar10 = 0;
    if ((bVar28 & 1) != 0) {
      pQVar3 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
      pQVar15 = QWidget::style(pQVar3);
      iVar10 = (**(code **)(*(long *)pQVar15 + 0xe0))(pQVar15,0x1b,0,pQVar3);
      bVar28 = this->scroll->scrollFlags;
    }
    if ((bVar28 & 2) != 0) {
      pQVar3 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
      pQVar15 = QWidget::style(pQVar3);
      iVar11 = (**(code **)(*(long *)pQVar15 + 0xe0))(pQVar15,0x1b,0,pQVar3);
    }
    pQVar15 = QWidget::style(this_00);
    uVar26 = 0;
    iVar12 = (**(code **)(*(long *)pQVar15 + 0xe0))(pQVar15,0x1d,0,this_00);
    pQVar15 = QWidget::style(this_00);
    iVar13 = (**(code **)(*(long *)pQVar15 + 0xe0))(pQVar15,0x1e,0,this_00);
    lVar23 = (this->super_QWidgetPrivate).actions.d.size;
    uVar22 = 0;
    if (location == ScrollTop) {
      uVar26 = 0;
      if (lVar23 != 0) {
        pQVar4 = (this->actionRects).d.ptr;
        lVar25 = 0;
        iVar11 = 0;
LAB_00457f01:
        if (*(QAction **)((long)(this->super_QWidgetPrivate).actions.d.ptr + lVar25) != action)
        goto code_r0x00457f07;
        uVar26 = iVar10 - iVar11;
LAB_00457fab:
        uVar22 = uVar26 >> 0x1f;
      }
    }
    else if (lVar23 != 0) {
      pQVar4 = (this->actionRects).d.ptr;
      lVar25 = 0;
      iVar21 = 0;
      do {
        iVar21 = ((iVar21 + *(int *)((long)&(pQVar4->y2).m_i + lVar25 * 2)) -
                 *(int *)((long)&(pQVar4->y1).m_i + lVar25 * 2)) + 1;
        if (*(QAction **)((long)(this->super_QWidgetPrivate).actions.d.ptr + lVar25) == action) {
          iVar2 = (this_00->data->crect).y1.m_i;
          iVar18 = (this_00->data->crect).y2.m_i;
          if (location == ScrollCenter) {
            iVar18 = iVar18 - iVar2;
            iVar10 = (iVar10 - (iVar11 + iVar21)) + ((iVar18 - (iVar18 + 1 >> 0x1f)) + 1 >> 1);
          }
          else {
            iVar10 = (iVar18 - (iVar11 + iVar21 + iVar2)) + 1;
          }
          if (iVar10 != 0) {
            uVar26 = iVar10 + iVar13 * -2;
            goto LAB_00457fab;
          }
          break;
        }
        lVar25 = lVar25 + 8;
      } while (lVar23 << 3 != lVar25);
LAB_00457fb7:
      uVar26 = 0;
    }
    lVar23 = (this->actionRects).d.size;
    uVar29 = uVar22;
    uVar19 = uVar26;
    if (lVar23 != 0) {
      pQVar4 = (this->actionRects).d.ptr;
      lVar25 = 0;
      do {
        uVar19 = ((uVar19 + *(int *)((long)&(pQVar4->y2).m_i + lVar25)) -
                 *(int *)((long)&(pQVar4->y1).m_i + lVar25)) + 1;
        if (((this_00->data->crect).y2.m_i - (this_00->data->crect).y1.m_i) + 1 < (int)uVar19) {
          uVar29 = uVar22 + 2;
          break;
        }
        lVar25 = lVar25 + 0x10;
      } while (lVar23 << 4 != lVar25);
    }
    bVar28 = (byte)uVar29;
    if ((((uVar29 & 2) == 0) && ((this->scroll->scrollFlags & 2) != 0)) &&
       (uVar26 = (((uVar26 - (iVar12 + iVar13 * 2)) + (this_00->data->crect).y2.m_i) -
                 (uVar19 + (this_00->data->crect).y1.m_i +
                 (int)(this->super_QWidgetPrivate).bottommargin +
                 (int)(this->super_QWidgetPrivate).topmargin)) + 1, (this->field_0x421 & 2) != 0)) {
      pQVar15 = QWidget::style(this_00);
      iVar10 = (**(code **)(*(long *)pQVar15 + 0xe0))(pQVar15,0x1f,0);
      uVar26 = uVar26 - iVar10;
    }
    if (uVar22 == 0) {
      uVar22 = 0;
      if ((this->scroll->scrollFlags & 1) == 0) {
        uVar22 = uVar26;
      }
    }
    else {
      uVar22 = uVar26 - iVar12;
    }
    QVar31 = popupGeometry(this,(QScreen *)0x0);
    pQVar15 = QWidget::style(this_00);
    iVar12 = (**(code **)(*(long *)pQVar15 + 0xe0))(pQVar15,0x20,0,this_00);
    pQVar5 = this_00->data;
    iVar10 = (pQVar5->crect).y1.m_i;
    iVar11 = (pQVar5->crect).y2.m_i;
    RVar14 = QVar31.y1.m_i;
    pQVar20 = this->scroll;
    if ((iVar11 - iVar10) + 1 < QVar31.y2.m_i.m_i - (RVar14.m_i + iVar12 * 2)) {
      uVar6 = (pQVar5->crect).x1;
      uVar7 = (pQVar5->crect).x2;
      uVar8 = (pQVar5->crect).y2;
      local_48.y2.m_i = uVar8;
      local_48.x2.m_i = uVar7;
      QVar9 = pQVar5->crect;
      iVar13 = pQVar20->scrollOffset;
      local_48.y1 = QVar9.y1.m_i;
      if ((uVar22 - iVar13 == 0 || (int)uVar22 < iVar13) ||
         ((uVar29 & pQVar20->scrollFlags & 1) == 0)) {
        if ((uVar29 & 2 & (uint)pQVar20->scrollFlags) != 0) {
          RVar24.m_i = (uVar22 - iVar13) + local_48.y1.m_i;
          if (RVar24.m_i <= iVar12 + RVar14.m_i) {
            RVar24.m_i = iVar12 + RVar14.m_i;
          }
          if (RVar24.m_i < local_48.y1.m_i) {
            local_48.y1.m_i = RVar24.m_i;
            local_48.x1.m_i = uVar6;
            bVar28 = bVar28 & 0xfe;
            uVar22 = 0;
            QVar9 = local_48;
          }
        }
      }
      else if ((uVar8 - local_48.y1.m_i) + 1 <
               (int)((uVar8 - local_48.y1.m_i) + (iVar13 - uVar22) + 1)) {
        local_48._0_12_ = QVar9._0_12_;
        local_48.y2.m_i = uVar8 + (iVar13 - uVar22);
        QVar9 = local_48;
      }
      local_48 = QVar9;
      RVar27.m_i = QVar31.y2.m_i.m_i - iVar12;
      RVar24.m_i = local_48.y2.m_i;
      if (RVar27.m_i < local_48.y2.m_i) {
        local_48.y2.m_i = RVar27.m_i;
        RVar24.m_i = RVar27.m_i;
      }
      RVar14.m_i = iVar12 + RVar14.m_i;
      RVar27.m_i = local_48.y1.m_i;
      if (local_48.y1.m_i < RVar14.m_i) {
        local_48.y1.m_i = RVar14.m_i;
        RVar27.m_i = RVar14.m_i;
      }
      if (((local_48.x1.m_i != (pQVar5->crect).x1.m_i) ||
          (local_48.x2.m_i != (pQVar5->crect).x2.m_i)) ||
         ((RVar27.m_i != iVar10 || (RVar24.m_i != iVar11)))) {
        QWidget::setGeometry(this_00,&local_48);
        pQVar20 = this->scroll;
      }
    }
    uVar22 = (int)uVar22 >> 0x1f & uVar22;
    uVar26 = pQVar20->scrollOffset;
    iVar10 = uVar22 - uVar26;
    if ((((this->field_0x420 & 1) == 0) && (uVar22 != uVar26)) && ((this->actionRects).d.size != 0))
    {
      lVar25 = 0;
      lVar23 = 0;
      uVar30 = 0;
      do {
        pQVar16 = QList<QRect>::data(&this->actionRects);
        piVar1 = (int *)((long)&(pQVar16->y2).m_i + lVar23 * 2);
        *piVar1 = *piVar1 + iVar10;
        piVar1 = (int *)((long)&(pQVar16->y1).m_i + lVar23 * 2);
        *piVar1 = *piVar1 + iVar10;
        this_01 = (this->widgetItems).d;
        if (((this_01 != (Data *)0x0) &&
            (pNVar17 = QHashPrivate::Data<QHashPrivate::Node<QAction*,QWidget*>>::findNode<QAction*>
                                 ((Data<QHashPrivate::Node<QAction*,QWidget*>> *)this_01,
                                  (QAction **)
                                  ((long)(this->super_QWidgetPrivate).actions.d.ptr + lVar23)),
            pNVar17 != (Node<QAction_*,_QWidget_*> *)0x0)) && (pNVar17->value != (QWidget *)0x0)) {
          QWidget::setGeometry(pNVar17->value,(QRect *)((long)&(pQVar16->x1).m_i + lVar25));
        }
        uVar30 = uVar30 + 1;
        lVar23 = lVar23 + 8;
        lVar25 = lVar25 + 0x10;
      } while (uVar30 < (ulong)(this->actionRects).d.size);
      pQVar20 = this->scroll;
      uVar26 = pQVar20->scrollOffset;
    }
    pQVar20->scrollOffset = uVar26 + iVar10;
    pQVar20->scrollFlags = bVar28;
    if (active) {
      setCurrentAction(this,action,-1,SelectedFromElsewhere,false);
    }
    QWidget::update(this_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
code_r0x00457f07:
  iVar11 = ((iVar11 + *(int *)((long)&(pQVar4->y2).m_i + lVar25 * 2)) -
           *(int *)((long)&(pQVar4->y1).m_i + lVar25 * 2)) + 1;
  lVar25 = lVar25 + 8;
  if (lVar23 << 3 == lVar25) goto LAB_00457fb7;
  goto LAB_00457f01;
}

Assistant:

void QMenuPrivate::scrollMenu(QAction *action, QMenuScroller::ScrollLocation location, bool active)
{
    Q_Q(QMenu);
    if (!scroll || !scroll->scrollFlags)
        return;
    updateActionRects();
    int newOffset = 0;
    const int topScroll = (scroll->scrollFlags & QMenuScroller::ScrollUp)   ? scrollerHeight() : 0;
    const int botScroll = (scroll->scrollFlags & QMenuScroller::ScrollDown) ? scrollerHeight() : 0;
    const int vmargin = q->style()->pixelMetric(QStyle::PM_MenuVMargin, nullptr, q);
    const int fw = q->style()->pixelMetric(QStyle::PM_MenuPanelWidth, nullptr, q);

    if (location == QMenuScroller::ScrollTop) {
        for(int i = 0, saccum = 0; i < actions.size(); i++) {
            if (actions.at(i) == action) {
                newOffset = topScroll - saccum;
                break;
            }
            saccum += actionRects.at(i).height();
        }
    } else {
        for(int i = 0, saccum = 0; i < actions.size(); i++) {
            saccum += actionRects.at(i).height();
            if (actions.at(i) == action) {
                if (location == QMenuScroller::ScrollCenter)
                    newOffset = ((q->height() / 2) - botScroll) - (saccum - topScroll);
                else
                    newOffset = (q->height() - botScroll) - saccum;
                break;
            }
        }
        if (newOffset)
            newOffset -= fw * 2;
    }

    //figure out which scroll flags
    uint newScrollFlags = QMenuScroller::ScrollNone;
    if (newOffset < 0) //easy and cheap one
        newScrollFlags |= QMenuScroller::ScrollUp;
    int saccum = newOffset;
    for(int i = 0; i < actionRects.size(); i++) {
        saccum += actionRects.at(i).height();
        if (saccum > q->height()) {
            newScrollFlags |= QMenuScroller::ScrollDown;
            break;
        }
    }

    if (!(newScrollFlags & QMenuScroller::ScrollDown) && (scroll->scrollFlags & QMenuScroller::ScrollDown)) {
        newOffset = q->height() - (saccum - newOffset) - fw*2 - vmargin - topmargin - bottommargin;    //last item at bottom
        if (tearoff)
            newOffset -= q->style()->pixelMetric(QStyle::PM_MenuTearoffHeight, nullptr, q);
    }

    if (!(newScrollFlags & QMenuScroller::ScrollUp) && (scroll->scrollFlags & QMenuScroller::ScrollUp)) {
        newOffset = 0;  //first item at top
    }

    if (newScrollFlags & QMenuScroller::ScrollUp)
        newOffset -= vmargin;

    QRect screen = popupGeometry();
    const int desktopFrame = q->style()->pixelMetric(QStyle::PM_MenuDesktopFrameWidth, nullptr, q);
    if (q->height() < screen.height()-(desktopFrame*2)-1) {
        QRect geom = q->geometry();
        if (newOffset > scroll->scrollOffset && (scroll->scrollFlags & newScrollFlags & QMenuScroller::ScrollUp)) { //scroll up
            const int newHeight = geom.height()-(newOffset-scroll->scrollOffset);
            if (newHeight > geom.height())
                geom.setHeight(newHeight);
        } else if (scroll->scrollFlags & newScrollFlags & QMenuScroller::ScrollDown) {
            int newTop = geom.top() + (newOffset-scroll->scrollOffset);
            if (newTop < desktopFrame+screen.top())
                newTop = desktopFrame+screen.top();
            if (newTop < geom.top()) {
                geom.setTop(newTop);
                newOffset = 0;
                newScrollFlags &= ~QMenuScroller::ScrollUp;
            }
        }
        if (geom.bottom() > screen.bottom() - desktopFrame)
            geom.setBottom(screen.bottom() - desktopFrame);
        if (geom.top() < desktopFrame+screen.top())
            geom.setTop(desktopFrame+screen.top());
        if (geom != q->geometry()) {
#if 0
            if (newScrollFlags & QMenuScroller::ScrollDown &&
               q->geometry().top() - geom.top() >= -newOffset)
                newScrollFlags &= ~QMenuScroller::ScrollDown;
#endif
            q->setGeometry(geom);
        }
    }

    //actually update flags
    const int delta = qMin(0, newOffset) - scroll->scrollOffset; //make sure the new offset is always negative
    if (!itemsDirty && delta) {
        //we've scrolled so we need to update the action rects
        for (int i = 0; i < actionRects.size(); ++i) {
            QRect &current = actionRects[i];
            current.moveTop(current.top() + delta);

            //we need to update the widgets geometry
            if (QWidget *w = widgetItems.value(actions.at(i)))
                w->setGeometry(current);
        }
    }
    scroll->scrollOffset += delta;
    scroll->scrollFlags = newScrollFlags;
    if (active)
        setCurrentAction(action);

    q->update();     //issue an update so we see all the new state..
}